

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O2

bool dxil_spv::emit_atomic_cmpxchg_instruction(Impl *impl,CallInst *instruction)

{
  StorageClass storage;
  bool bVar1;
  Id IVar2;
  RawWidth width;
  Id type_id;
  Builder *this;
  Value *pVVar3;
  mapped_type *meta;
  Type *pTVar4;
  BufferAccessInfo BVar5;
  Operation *this_00;
  uint32_t i;
  ulong uVar6;
  ComponentType component_type;
  uint32_t num_coords_full;
  Id local_5c;
  Id local_58;
  Id image_id;
  uint32_t num_coords;
  uint local_4c;
  Id coords [3];
  
  this = Converter::Impl::builder(impl);
  pVVar3 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  image_id = Converter::Impl::get_id_for_value(impl,pVVar3,0);
  if (image_id == (impl->ags).magic_ptr_id) {
    bVar1 = emit_magic_ags_instruction(impl,instruction);
    return bVar1;
  }
  meta = std::__detail::
         _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
         ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)&impl->handle_to_resource_meta,&image_id);
  emit_buffer_synchronization_validation(impl,instruction,AtomicRMW);
  coords[2] = 0;
  coords[0] = 0;
  coords[1] = 0;
  num_coords_full = 0;
  num_coords = 0;
  if ((byte)(meta->kind - TypedBuffer) < 3) {
    IVar2 = meta->index_offset_id;
    pTVar4 = LLVMBC::Value::getType((Value *)instruction);
    BVar5 = build_buffer_access(impl,instruction,0,IVar2,pTVar4,1);
    coords[0] = BVar5.index_id;
    num_coords_full = 1;
    num_coords = 1;
  }
  else {
    bVar1 = get_image_dimensions(impl,image_id,&num_coords_full,&num_coords);
    if (3 < num_coords_full || !bVar1) {
      return false;
    }
    for (uVar6 = 0; uVar6 < num_coords_full; uVar6 = uVar6 + 1) {
      pVVar3 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,(int)uVar6 + 2);
      IVar2 = Converter::Impl::get_id_for_value(impl,pVVar3,0);
      coords[uVar6] = IVar2;
    }
  }
  IVar2 = spv::Builder::makeUintType(this,0x20);
  IVar2 = Converter::Impl::build_vector(impl,IVar2,coords,num_coords_full);
  storage = meta->storage;
  pTVar4 = LLVMBC::Value::getType((Value *)instruction);
  width = get_buffer_access_bits_per_component(impl,storage,pTVar4);
  if (width == B64) {
    spv::Builder::addCapability(this,CapabilityInt64Atomics);
  }
  IVar2 = emit_atomic_access_chain(impl,meta,width,image_id,IVar2,&component_type);
  if (meta->non_uniform == true) {
    spv::Builder::addDecoration(this,IVar2,DecorationNonUniform,-1);
  }
  type_id = Converter::Impl::get_type_id(impl,component_type,1,1,false);
  this_00 = Converter::Impl::allocate(impl,OpAtomicCompareExchange,(Value *)instruction,type_id);
  pVVar3 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,5);
  local_58 = Converter::Impl::get_id_for_value(impl,pVVar3,0);
  pVVar3 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,6);
  local_5c = Converter::Impl::get_id_for_value(impl,pVVar3,0);
  local_4c = (uint)component_type;
  local_58 = Converter::Impl::fixup_store_type_atomic(impl,component_type,1,local_58);
  local_5c = Converter::Impl::fixup_store_type_atomic(impl,component_type,1,local_5c);
  Operation::add_id(this_00,IVar2);
  IVar2 = spv::Builder::makeUintConstant(this,1,false);
  Operation::add_id(this_00,IVar2);
  IVar2 = spv::Builder::makeUintConstant(this,0,false);
  Operation::add_id(this_00,IVar2);
  IVar2 = spv::Builder::makeUintConstant(this,0,false);
  Operation::add_id(this_00,IVar2);
  Operation::add_id(this_00,local_5c);
  Operation::add_id(this_00,local_58);
  Converter::Impl::add(impl,this_00,meta->rov);
  Converter::Impl::fixup_load_type_atomic(impl,(ComponentType)local_4c,1,(Value *)instruction);
  return true;
}

Assistant:

bool emit_atomic_cmpxchg_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));

	if (image_id == impl.ags.magic_ptr_id)
		return emit_magic_ags_instruction(impl, instruction);

	const auto &meta = impl.handle_to_resource_meta[image_id];

	emit_buffer_synchronization_validation(impl, instruction, BDAOperation::AtomicRMW);

	spv::Id coords[3] = {};
	uint32_t num_coords_full = 0, num_coords = 0;

	if (meta.kind == DXIL::ResourceKind::StructuredBuffer ||
	    meta.kind == DXIL::ResourceKind::RawBuffer ||
	    meta.kind == DXIL::ResourceKind::TypedBuffer)
	{
		auto access = build_buffer_access(impl, instruction, 0, meta.index_offset_id, instruction->getType(), 1);
		coords[0] = access.index_id;
		num_coords = 1;
		num_coords_full = 1;
	}
	else
	{
		if (!get_image_dimensions(impl, image_id, &num_coords_full, &num_coords))
			return false;

		if (num_coords_full > 3)
			return false;

		for (uint32_t i = 0; i < num_coords_full; i++)
			coords[i] = impl.get_id_for_value(instruction->getOperand(2 + i));
	}

	spv::Id coord = impl.build_vector(builder.makeUintType(32), coords, num_coords_full);

	auto width = get_buffer_access_bits_per_component(impl, meta.storage, instruction->getType());
	if (width == RawWidth::B64)
		builder.addCapability(spv::CapabilityInt64Atomics);

	DXIL::ComponentType component_type;
	spv::Id counter_ptr_id = emit_atomic_access_chain(impl, meta, width, image_id, coord, component_type);

	if (meta.non_uniform)
		builder.addDecoration(counter_ptr_id, spv::DecorationNonUniformEXT);

	Operation *op =
	    impl.allocate(spv::OpAtomicCompareExchange, instruction, impl.get_type_id(component_type, 1, 1));

	spv::Id comparison_id = impl.get_id_for_value(instruction->getOperand(5));
	spv::Id new_value_id = impl.get_id_for_value(instruction->getOperand(6));
	comparison_id = impl.fixup_store_type_atomic(component_type, 1, comparison_id);
	new_value_id = impl.fixup_store_type_atomic(component_type, 1, new_value_id);

	op->add_id(counter_ptr_id);
	op->add_id(builder.makeUintConstant(spv::ScopeDevice));
	op->add_id(builder.makeUintConstant(0));
	op->add_id(builder.makeUintConstant(0));
	op->add_id(new_value_id);
	op->add_id(comparison_id);
	impl.add(op, meta.rov);
	impl.fixup_load_type_atomic(component_type, 1, instruction);
	return true;
}